

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickle_event.c
# Opt level: O3

void PickleEvent_delete(Event *event)

{
  if ((event != (Event *)0x0) && (event->event_type == Gherkin_PickleEvent)) {
    if ((Pickle *)event[1].event_print != (Pickle *)0x0) {
      Pickle_delete((Pickle *)event[1].event_print);
    }
    free(event);
    return;
  }
  return;
}

Assistant:

static void PickleEvent_delete(const Event* event) {
    if (!event || event->event_type != Gherkin_PickleEvent) {
        return;
    }
    const PickleEvent* pickle_event = (const PickleEvent*) event;
    if (pickle_event->pickle) {
        Pickle_delete(pickle_event->pickle);
    }
    free((void*)pickle_event);
}